

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

void __thiscall
LinkedObjectFile::symbol_link_offset
          (LinkedObjectFile *this,int source_segment,int source_offset,char *name)

{
  pointer pvVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 *puVar7;
  
  if ((source_offset & 3U) != 0) {
    __assert_fail("(source_offset % 4) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0x94,"void LinkedObjectFile::symbol_link_offset(int, int, const char *)");
  }
  uVar5 = (ulong)source_segment;
  pvVar1 = (this->words_by_seg).
           super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->words_by_seg).
                 super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  uVar6 = uVar5;
  if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
    uVar6 = (ulong)(source_offset >> 2);
    lVar2 = *(long *)&pvVar1[uVar5].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                      _M_impl.super__Vector_impl_data;
    uVar4 = ((long)*(pointer *)
                    ((long)&pvVar1[uVar5].
                            super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                            super__Vector_impl_data + 8) - lVar2 >> 4) * -0x5555555555555555;
    if (uVar6 <= uVar4 && uVar4 - uVar6 != 0) {
      if (*(int *)(lVar2 + uVar6 * 0x30) != 0) {
        __assert_fail("word.kind == LinkedWord::PLAIN_DATA",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                      ,0x96,"void LinkedObjectFile::symbol_link_offset(int, int, const char *)");
      }
      puVar7 = (undefined4 *)(lVar2 + uVar6 * 0x30);
      *puVar7 = 6;
      pcVar3 = *(char **)(puVar7 + 6);
      strlen(name);
      std::__cxx11::string::_M_replace((ulong)(puVar7 + 4),0,pcVar3,(ulong)name);
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6,uVar4
            );
}

Assistant:

void LinkedObjectFile::symbol_link_offset(int source_segment, int source_offset, const char* name) {
  assert((source_offset % 4) == 0);
  auto& word = words_by_seg.at(source_segment).at(source_offset / 4);
  assert(word.kind == LinkedWord::PLAIN_DATA);
  word.kind = LinkedWord::SYM_OFFSET;
  word.symbol_name = name;
}